

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::
findImpl<QFontDatabasePrivate::ExtendedScript>
          (QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *this,ExtendedScript *key)

{
  piter it_00;
  bool bVar1;
  size_t bucket_00;
  QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *in_RDI;
  long in_FS_OFFSET;
  size_t bucket;
  Bucket it;
  Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>
  *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>
  *in_stack_ffffffffffffff90;
  Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>
  *in_stack_ffffffffffffffa0;
  Bucket local_38;
  Bucket local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty(in_RDI);
  if (bVar1) {
    local_18 = (piter)end(in_RDI);
  }
  else {
    local_28.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_28.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QHashPrivate::
               Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
               findBucket<QFontDatabasePrivate::ExtendedScript>
                         (in_stack_ffffffffffffffa0,(ExtendedScript *)in_RDI);
    bucket_00 = QHashPrivate::
                Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
                Bucket::toBucketIndex(&local_28,in_RDI->d);
    detach((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)in_stack_ffffffffffffff90
          );
    QHashPrivate::Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
    Bucket::Bucket(&local_38,in_RDI->d,bucket_00);
    bVar1 = QHashPrivate::
            Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::Bucket
            ::isUnused((Bucket *)0x7575eb);
    if (bVar1) {
      local_18 = (piter)end(in_RDI);
    }
    else {
      QHashPrivate::Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>
      ::Bucket::toIterator((Bucket *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      it_00.bucket = (size_t)in_RDI;
      it_00.d = in_stack_ffffffffffffff90;
      iterator::iterator((iterator *)in_stack_ffffffffffffff88,it_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_18;
  }
  __stack_chk_fail();
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }